

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-test.c++
# Opt level: O0

void __thiscall
capnp::_::anon_unknown_0::TestVat::ConnectionImpl::initiateIdleShutdown(ConnectionImpl *this)

{
  PromiseFulfiller<void> *pPVar1;
  undefined1 local_49;
  Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *local_48;
  Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *f;
  Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *_f310;
  Maybe<kj::Own<capnp::IncomingRpcMessage,_std::nullptr_t>_> local_20;
  ConnectionImpl *local_10;
  ConnectionImpl *this_local;
  
  this->initiatedIdleShutdown = true;
  local_10 = this;
  kj::Maybe<kj::Own<capnp::IncomingRpcMessage,_std::nullptr_t>_>::Maybe();
  kj::ProducerConsumerQueue<kj::Maybe<kj::Own<capnp::IncomingRpcMessage,_std::nullptr_t>_>_>::push
            (&this->messageQueue,&local_20);
  kj::Maybe<kj::Own<capnp::IncomingRpcMessage,_std::nullptr_t>_>::~Maybe(&local_20);
  local_48 = kj::_::readMaybe<kj::PromiseFulfiller<void>,decltype(nullptr)>(&this->fulfillOnEnd);
  if (local_48 != (Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *)0x0) {
    f = local_48;
    pPVar1 = kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>::operator->(local_48);
    (*(pPVar1->super_PromiseRejector)._vptr_PromiseRejector[2])(pPVar1,&local_49);
  }
  return;
}

Assistant:

void initiateIdleShutdown() {
      initiatedIdleShutdown = true;
      messageQueue.push(kj::none);
      KJ_IF_SOME(f, fulfillOnEnd) {
        f->fulfill();
      }
    }